

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O1

ColorTracker * __thiscall ColorTracker::getHSV(ColorTracker *this,Mat *imgBGR)

{
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  Size *pSVar3;
  long *plVar4;
  int in_R8D;
  _InputArray local_170;
  long lStack_158;
  long *local_150;
  Mat *local_148;
  long local_140;
  long lStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((*(uint *)imgBGR & 0xff8) == 0x10) {
    cv::Mat::Mat((Mat *)this);
    local_140 = 0;
    local_150 = (long *)CONCAT44(local_150._4_4_,0x1010000);
    local_170.sz.width = 0;
    local_170.sz.height = 0;
    local_170.flags = 0x2010000;
    local_170.obj = this;
    local_148 = imgBGR;
    cv::cvtColor((cv *)&local_150,&local_170,(_OutputArray *)0x28,0,in_R8D);
    return this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,"");
  std::operator+(&local_90,"in ",&local_d0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_130._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar2) {
    local_130.field_2._M_allocated_capacity = *psVar2;
    local_130.field_2._8_8_ = plVar1[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar2;
  }
  local_130._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_b0,0x9d);
  std::operator+(&local_70,&local_130,&local_b0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_110._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar2) {
    local_110.field_2._M_allocated_capacity = *psVar2;
    local_110.field_2._8_4_ = (undefined4)plVar1[3];
    local_110.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar2;
  }
  local_110._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"getHSV","");
  std::operator+(&local_50,&local_110,&local_f0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_170._0_8_ = *plVar1;
  pSVar3 = (Size *)(plVar1 + 2);
  if ((Size *)local_170._0_8_ == pSVar3) {
    local_170.sz = *pSVar3;
    lStack_158 = plVar1[3];
    local_170._0_8_ = &local_170.sz;
  }
  else {
    local_170.sz = *pSVar3;
  }
  local_170.obj = (void *)plVar1[1];
  *plVar1 = (long)pSVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_170);
  local_150 = (long *)*plVar1;
  plVar4 = plVar1 + 2;
  if (local_150 == plVar4) {
    local_140 = *plVar4;
    lStack_138 = plVar1[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar4;
  }
  local_148 = (Mat *)plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_150);
  *(undefined ***)this_00 = &PTR__runtime_error_0011e9d8;
  __cxa_throw(this_00,&ProcessingException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Mat ColorTracker::getHSV(const Mat& imgBGR){
    if(imgBGR.channels()!=3){
        //cout << "invalid input" << endl;
        throw ProcessingException(WHERE + "invalid input: passed image must have 3 channels");
    }

    Mat imgHSV;
    cv::cvtColor(imgBGR,imgHSV,cv::COLOR_BGR2HSV);

    return imgHSV;
}